

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O2

void __thiscall Wasm::WasmBinaryReader::ShuffleNode(WasmBinaryReader *this)

{
  uint32 *puVar1;
  uchar uVar2;
  long lVar3;
  
  CheckBytesLeft(this,0x10);
  for (lVar3 = 0x10; lVar3 != 0x20; lVar3 = lVar3 + 1) {
    uVar2 = ReadConst<unsigned_char>(this);
    *(uchar *)((long)&(this->super_WasmReaderBase)._vptr_WasmReaderBase + lVar3) = uVar2;
  }
  puVar1 = &(this->m_funcState).count;
  *puVar1 = *puVar1 + 0x10;
  return;
}

Assistant:

void WasmBinaryReader::ShuffleNode()
{
    CheckBytesLeft(Simd::MAX_LANES);
    for (uint32 i = 0; i < Simd::MAX_LANES; i++)
    {
        m_currentNode.shuffle.indices[i] = ReadConst<uint8>();
    }
    m_funcState.count += Simd::MAX_LANES;
}